

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_3_2::TypedAttribute<Imf_3_2::ChannelList>::TypedAttribute
          (TypedAttribute<Imf_3_2::ChannelList> *this)

{
  Attribute *in_RDI;
  
  Attribute::Attribute(in_RDI);
  in_RDI->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_004c0130;
  ChannelList::ChannelList((ChannelList *)0x1773c4);
  return;
}

Assistant:

TypedAttribute (const TypedAttribute<T>& other) = default;